

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Moira.cpp
# Opt level: O3

u16 __thiscall moira::Moira::availabilityMask(Moira *this,Instr I,Mode M,Size S)

{
  u16 uVar1;
  u16 uVar2;
  bool bVar3;
  
  uVar1 = availabilityMask(this,I);
  uVar2 = uVar1;
  if (I - BCC < 0xe) {
switchD_001320af_caseD_1c:
    bVar3 = S == 4;
LAB_00132090:
    if (bVar3) {
      uVar2 = uVar1 & 0xfffc;
    }
  }
  else {
    switch(I) {
    case BRA:
    case BSR:
    case CHK:
      goto switchD_001320af_caseD_1c;
    case BSET:
    case BTST:
    case CLR:
    case CMP:
    case CMPA:
      break;
    case CMPI:
      if (M - DIPC < 2) {
        uVar2 = uVar1 & 0xfffe;
      }
      break;
    default:
      if (I == LINK) goto switchD_001320af_caseD_1c;
      if (I != TST) {
        return uVar1;
      }
      if (8 < (int)M) {
        uVar2 = uVar1 & 0xfffc;
      }
      bVar3 = M == AN;
      goto LAB_00132090;
    }
  }
  return uVar2;
}

Assistant:

u16
Moira::availabilityMask(Instr I, Mode M, Size S) const
{
    u16 mask = availabilityMask(I);

    switch (I) {

        case Instr::CMPI:

            if (isPrgMode(M)) mask &= AV::M68010_UP;
            break;

        case Instr::CHK: case Instr::LINK: case Instr::BRA: case Instr::BHI: case Instr::BLS: case Instr::BCC: case Instr::BCS:
        case Instr::BNE: case Instr::BEQ: case Instr::BVC: case Instr::BVS: case Instr::BPL: case Instr::BMI: case Instr::BGE:
        case Instr::BLT: case Instr::BGT: case Instr::BLE: case Instr::BSR:

            if (S == Long) mask &= AV::M68020_UP;
            break;

        case Instr::TST:

            if (M == Mode(1) || M >= Mode(9)) mask &= AV::M68020_UP;
            break;

        default:

            break;
    }

    return mask;
}